

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall gnilk::LogManager::IterateSinks(LogManager *this,SinkDelegate *delegate)

{
  mutex *__mutex;
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  pointer puVar4;
  LogSink *local_30;
  
  __mutex = &this->sinkLock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
LAB_00188e55:
    uVar3 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar3);
  }
  puVar4 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      iVar2 = (*((puVar4->_M_t).
                 super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                 .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl)->
                _vptr_LogSinkInstance[2])();
      local_30 = (LogSink *)CONCAT44(extraout_var,iVar2);
      if ((delegate->super__Function_base)._M_manager == (_Manager_type)0x0) {
        iVar2 = std::__throw_bad_function_call();
        goto LAB_00188e55;
      }
      (*delegate->_M_invoker)((_Any_data *)delegate,&local_30);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void LogManager::IterateSinks(const SinkDelegate &delegate) {
    std::lock_guard<std::mutex> lock(sinkLock);
    for(auto &sink : sinks) {
        delegate(sink->GetSink());
    }
}